

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testMissingBeta1Parameter(void)

{
  bool bVar1;
  NeuralNetwork *pNVar2;
  ostream *poVar3;
  Result local_138;
  Result local_110;
  set<long,_std::less<long>,_std::allocator<long>_> local_e8;
  set<long,_std::less<long>,_std::allocator<long>_> local_b8;
  undefined4 local_7c;
  undefined1 local_78 [8];
  Result res;
  undefined1 local_40 [8];
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax((Model *)local_40);
  CoreML::Model::validate((Result *)local_78,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_78);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3a5);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    addLearningRate<CoreML::Specification::NeuralNetwork>
              (pNVar2,kAdamOptimizer,0.699999988079071,0.0,1.0);
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_b8._M_t._M_impl._0_8_ = 0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_b8);
    addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar2,kAdamOptimizer,10,5,100,&local_b8)
    ;
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_b8);
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_e8._M_t._M_impl._0_8_ = 0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_e8);
    addEpochs<CoreML::Specification::NeuralNetwork>(pNVar2,100,1,100,&local_e8);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_e8);
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    addBeta2(pNVar2,kAdamOptimizer,0.699999988079071,0.0,1.0);
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    addEps(pNVar2,kAdamOptimizer,0.699999988079071,0.0,1.0);
    CoreML::Model::validate(&local_110,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_78,&local_110);
    CoreML::Result::~Result(&local_110);
    bVar1 = CoreML::Result::good((Result *)local_78);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3af);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((res).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
      addBeta1(pNVar2,kAdamOptimizer,0.699999988079071,0.0,1.0);
      CoreML::Model::validate(&local_138,(Model *)local_40);
      CoreML::Result::operator=((Result *)local_78,&local_138);
      CoreML::Result::~Result(&local_138);
      bVar1 = CoreML::Result::good((Result *)local_78);
      if (bVar1) {
        m._oneof_case_[0] = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3b5);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(res).good()");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
    }
  }
  local_7c = 1;
  CoreML::Result::~Result((Result *)local_78);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m._oneof_case_[0];
}

Assistant:

int testMissingBeta1Parameter() {

    Specification::Model m;

    // basic neural network model without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // now add an updatable model parameter.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());
    addBeta2(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addEps(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    addBeta1(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    // expect validation to pass.
    res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}